

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getStandardFormLp
          (Highs *this,HighsInt *num_col,HighsInt *num_row,HighsInt *num_nz,double *offset,
          double *cost,double *rhs,HighsInt *start,HighsInt *index,double *value)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  value_type *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol;
  HighsStatus status;
  Highs *in_stack_000005d8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  int local_40;
  int local_3c;
  int local_38;
  
  logHeader((Highs *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if ((*(byte *)(in_RDI + 0x1248) & 1) == 0) {
    formStandardFormLp(in_stack_000005d8);
  }
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1258));
  *in_RSI = (int)sVar1;
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1270));
  *in_RDX = (int)sVar1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),(long)*in_RSI);
  *in_RCX = *pvVar2;
  *in_R8 = *(undefined8 *)(in_RDI + 0x1250);
  for (local_38 = 0; local_38 < *in_RSI; local_38 = local_38 + 1) {
    if (in_R9 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1258),
                          (long)local_38);
      *(value_type *)(in_R9 + (long)local_38 * 8) = *pvVar3;
    }
    if (in_stack_00000010 != 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),(long)local_38);
      *(value_type *)(in_stack_00000010 + (long)local_38 * 4) = *pvVar2;
    }
    if ((_iRow != 0) || (_iCol != 0)) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),(long)local_38);
      local_3c = *pvVar2;
      while (iVar4 = local_3c,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),
                                (long)(local_38 + 1)), iVar4 < *pvVar2) {
        if (_iRow != 0) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x12c8),(long)local_3c)
          ;
          *(value_type *)(_iRow + (long)local_3c * 4) = *pvVar2;
        }
        if (_iCol != 0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12e0),
                              (long)local_3c);
          *(value_type *)(_iCol + (long)local_3c * 8) = *pvVar3;
        }
        local_3c = local_3c + 1;
      }
    }
  }
  if (in_stack_00000010 != 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1298),(long)*in_RSI);
    *(value_type *)(in_stack_00000010 + (long)*in_RSI * 4) = *pvVar2;
  }
  if (in_stack_00000008 != 0) {
    for (local_40 = 0; local_40 < *in_RDX; local_40 = local_40 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1270),
                          (long)local_40);
      *(value_type *)(in_stack_00000008 + (long)local_40 * 8) = *pvVar3;
    }
  }
  return kOk;
}

Assistant:

HighsStatus Highs::getStandardFormLp(HighsInt& num_col, HighsInt& num_row,
                                     HighsInt& num_nz, double& offset,
                                     double* cost, double* rhs, HighsInt* start,
                                     HighsInt* index, double* value) {
  this->logHeader();
  if (!this->standard_form_valid_) {
    HighsStatus status = formStandardFormLp();
    assert(status == HighsStatus::kOk);
  }
  num_col = this->standard_form_cost_.size();
  num_row = this->standard_form_rhs_.size();
  num_nz = this->standard_form_matrix_.start_[num_col];
  offset = this->standard_form_offset_;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (cost) cost[iCol] = this->standard_form_cost_[iCol];
    if (start) start[iCol] = this->standard_form_matrix_.start_[iCol];
    if (index || value) {
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        if (index) index[iEl] = this->standard_form_matrix_.index_[iEl];
        if (value) value[iEl] = this->standard_form_matrix_.value_[iEl];
      }
    }
  }
  if (start) start[num_col] = this->standard_form_matrix_.start_[num_col];
  if (rhs) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++)
      rhs[iRow] = this->standard_form_rhs_[iRow];
  }
  return HighsStatus::kOk;
}